

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O1

void lj_ir_growbot(jit_State *J)

{
  undefined8 *puVar1;
  uint uVar2;
  IRIns *pIVar3;
  IRRef IVar4;
  uint uVar5;
  IRIns *__src;
  
  uVar2 = J->irbotlim;
  __src = J->irbuf + uVar2;
  IVar4 = (J->cur).nins;
  uVar5 = J->irtoplim - uVar2;
  if (IVar4 + (uVar5 >> 1) < J->irtoplim) {
    uVar5 = uVar5 >> 2;
    memmove(__src + uVar5,__src,(ulong)(IVar4 - uVar2) << 3);
    uVar2 = J->irbotlim - uVar5;
    J->irbotlim = uVar2;
    IVar4 = J->irtoplim - uVar5;
    pIVar3 = __src;
  }
  else {
    pIVar3 = (IRIns *)lj_mem_realloc(J->L,(void *)0x0,0,(ulong)(uVar5 * 2) << 3);
    uVar2 = uVar5 >> 1;
    if (0xff < uVar5) {
      uVar2 = 0x80;
    }
    memcpy(pIVar3 + uVar2,__src,(ulong)((J->cur).nins - J->irbotlim) << 3);
    puVar1 = (undefined8 *)(J->L->glref).ptr64;
    puVar1[2] = puVar1[2] + (ulong)uVar5 * -8;
    (*(code *)*puVar1)(puVar1[1],__src,(ulong)uVar5 * 8,0);
    uVar2 = J->irbotlim - uVar2;
    J->irbotlim = uVar2;
    IVar4 = uVar2 + uVar5 * 2;
  }
  J->irtoplim = IVar4;
  J->irbuf = pIVar3 + -(ulong)uVar2;
  (J->cur).ir = pIVar3 + -(ulong)uVar2;
  return;
}

Assistant:

static void lj_ir_growbot(jit_State *J)
{
  IRIns *baseir = J->irbuf + J->irbotlim;
  MSize szins = J->irtoplim - J->irbotlim;
  lj_assertJ(szins != 0, "zero IR size");
  lj_assertJ(J->cur.nk == J->irbotlim || J->cur.nk-1 == J->irbotlim,
	     "unexpected IR growth");
  if (J->cur.nins + (szins >> 1) < J->irtoplim) {
    /* More than half of the buffer is free on top: shift up by a quarter. */
    MSize ofs = szins >> 2;
    memmove(baseir + ofs, baseir, (J->cur.nins - J->irbotlim)*sizeof(IRIns));
    J->irbotlim -= ofs;
    J->irtoplim -= ofs;
    J->cur.ir = J->irbuf = baseir - J->irbotlim;
  } else {
    /* Double the buffer size, but split the growth amongst top/bottom. */
    IRIns *newbase = lj_mem_newt(J->L, 2*szins*sizeof(IRIns), IRIns);
    MSize ofs = szins >= 256 ? 128 : (szins >> 1);  /* Limit bottom growth. */
    memcpy(newbase + ofs, baseir, (J->cur.nins - J->irbotlim)*sizeof(IRIns));
    lj_mem_free(G(J->L), baseir, szins*sizeof(IRIns));
    J->irbotlim -= ofs;
    J->irtoplim = J->irbotlim + 2*szins;
    J->cur.ir = J->irbuf = newbase - J->irbotlim;
  }
}